

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

value * __thiscall
mjs::interpreter::impl::operator()
          (value *__return_storage_ptr__,impl *this,identifier_expression *e)

{
  scope *this_00;
  reference rStack_38;
  
  this_00 = (scope *)gc_heap_ptr_untyped::get(&(this->active_scope_).super_gc_heap_ptr_untyped);
  scope::lookup(&rStack_38,this_00,&e->id_);
  value::value(__return_storage_ptr__,&rStack_38);
  reference::~reference(&rStack_38);
  return __return_storage_ptr__;
}

Assistant:

value operator()(const identifier_expression& e) {
        // §10.1.4
        return value{active_scope_->lookup(e.id())};
    }